

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O3

void __thiscall sznet::net::TcpClient::removeConnection(TcpClient *this,TcpConnectionPtr *conn)

{
  MutexLock *mutex;
  EventLoop *pEVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  ulong __n;
  int iVar4;
  bool bVar5;
  uint uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  SourceFile file;
  Logger local_1038;
  string local_68;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  pEVar1 = this->m_loop;
  bVar5 = EventLoop::isInLoopThread(pEVar1);
  if (!bVar5) {
    EventLoop::abortNotInLoopThread(pEVar1);
  }
  if (this->m_loop ==
      ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      m_loop) {
    mutex = &this->m_mutex;
    sz_mutex_lock(&mutex->m_mutex);
    MutexLock::assignHolder(mutex);
    if ((this->m_connection).
        super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
      p_Var2 = (this->m_connection).
               super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      (this->m_mutex).m_holder = 0;
      sz_mutex_unlock(&mutex->m_mutex);
      peVar3 = (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      pEVar1 = this->m_loop;
      p_Var2 = (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      local_48._8_8_ = 0;
      local_48._M_unused._M_object = operator_new(0x20);
      local_30 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                 ::_M_invoke;
      *(code **)local_48._M_unused._0_8_ = TcpConnection::connectDestroyed;
      *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
      *(element_type **)((long)local_48._M_unused._0_8_ + 0x10) = peVar3;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48._M_unused._0_8_ + 0x18) =
           p_Var2;
      local_38 = std::
                 _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>_>
                 ::_M_manager;
      EventLoop::queueInLoop(pEVar1,(Functor *)&local_48);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      if ((this->m_retry == true) && (this->m_connect == true)) {
        if (g_logLevel < 3) {
          file._8_8_ = 0xd;
          file.m_data = "TcpClient.cpp";
          Logger::Logger(&local_1038,file,0xa4);
          iVar4 = (int)&local_1038 + 0xfb0;
          uVar6 = iVar4 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
          if (0x13 < uVar6) {
            builtin_strncpy(local_1038.m_impl.m_stream.m_buffer.m_cur,"TcpClient::connect[",0x13);
            local_1038.m_impl.m_stream.m_buffer.m_cur =
                 local_1038.m_impl.m_stream.m_buffer.m_cur + 0x13;
            uVar6 = iVar4 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
          }
          __n = (this->m_name)._M_string_length;
          if (__n < (ulong)(long)(int)uVar6) {
            memcpy(local_1038.m_impl.m_stream.m_buffer.m_cur,(this->m_name)._M_dataplus._M_p,__n);
            local_1038.m_impl.m_stream.m_buffer.m_cur =
                 local_1038.m_impl.m_stream.m_buffer.m_cur + __n;
            uVar6 = iVar4 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur;
          }
          if (0x14 < uVar6) {
            builtin_strncpy(local_1038.m_impl.m_stream.m_buffer.m_cur,"] - Reconnecting to ",0x14);
            local_1038.m_impl.m_stream.m_buffer.m_cur =
                 local_1038.m_impl.m_stream.m_buffer.m_cur + 0x14;
          }
          InetAddress::toIpPort_abi_cxx11_
                    (&local_68,
                     &((this->m_connector).
                       super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->m_serverAddr);
          if (local_68._M_string_length <
              (ulong)(long)(iVar4 - (int)local_1038.m_impl.m_stream.m_buffer.m_cur)) {
            memcpy(local_1038.m_impl.m_stream.m_buffer.m_cur,local_68._M_dataplus._M_p,
                   local_68._M_string_length);
            local_1038.m_impl.m_stream.m_buffer.m_cur =
                 local_1038.m_impl.m_stream.m_buffer.m_cur + local_68._M_string_length;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          Logger::~Logger(&local_1038);
        }
        Connector::restart((this->m_connector).
                           super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
      }
      return;
    }
    __assert_fail("m_connection == conn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                  ,0x9d,"void sznet::net::TcpClient::removeConnection(const TcpConnectionPtr &)");
  }
  __assert_fail("m_loop == conn->getLoop()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpClient.cpp"
                ,0x99,"void sznet::net::TcpClient::removeConnection(const TcpConnectionPtr &)");
}

Assistant:

void TcpClient::removeConnection(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	assert(m_loop == conn->getLoop());

	{
		MutexLockGuard lock(m_mutex);
		assert(m_connection == conn);
		m_connection.reset();
	}

	m_loop->queueInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
	if (m_retry && m_connect)
	{
		LOG_INFO << "TcpClient::connect[" << m_name << "] - Reconnecting to "
				 << m_connector->serverAddress().toIpPort();
		m_connector->restart();
	}
}